

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

void __thiscall dgPolyhedra::dgPolyhedra(dgPolyhedra *this,dgPolyhedra *polyhedra)

{
  HaI32 *index;
  HaI64 *userdata;
  dgRedBackNode *pdVar1;
  dgTreeNode *pdVar2;
  dgEdge *pdVar3;
  ulong uVar4;
  dgRedBackNode *pdVar5;
  dgEdge *pdVar6;
  long lVar7;
  Iterator iter;
  Iterator local_40;
  
  pdVar1 = (dgRedBackNode *)0x0;
  (this->super_dgTree<dgEdge,_long>).m_count = 0;
  (this->super_dgTree<dgEdge,_long>).m_head = (dgTreeNode *)0x0;
  this->m_baseMark = 0;
  this->m_edgeMark = 0;
  (this->super_dgTree<dgEdge,_long>)._vptr_dgTree = (_func_int **)&PTR__dgPolyhedra_00b6aa28;
  this->m_faceSecuence = 0;
  index = (HaI32 *)malloc(0x10000);
  userdata = (HaI64 *)malloc(0x20000);
  local_40.m_ptr = (dgRedBackNode *)0x0;
  pdVar2 = (polyhedra->super_dgTree<dgEdge,_long>).m_head;
  local_40.m_tree = &polyhedra->super_dgTree<dgEdge,_long>;
  if (pdVar2 != (dgTreeNode *)0x0) {
    pdVar1 = dgRedBackNode::Minimum(&pdVar2->super_dgRedBackNode);
  }
  local_40.m_ptr = pdVar1;
  do {
    pdVar1 = local_40.m_ptr;
    if (local_40.m_ptr == (dgRedBackNode *)0x0) {
      EndFace(this);
      this->m_faceSecuence = polyhedra->m_faceSecuence;
      free(userdata);
      free(index);
      return;
    }
    if (-1 < *(int *)((long)&local_40.m_ptr[1]._vptr_dgRedBackNode + 4)) {
      pdVar2 = (this->super_dgTree<dgEdge,_long>).m_head;
      if (pdVar2 != (dgTreeNode *)0x0) {
        uVar4 = (ulong)*(uint *)&local_40.m_ptr[1]._vptr_dgRedBackNode << 0x20 |
                (long)**(int **)&local_40.m_ptr[1].field_0x20;
        do {
          lVar7 = 8;
          if ((pdVar2->m_key <= (long)uVar4) && (lVar7 = 0x10, (long)uVar4 <= pdVar2->m_key))
          goto LAB_0087b08e;
          pdVar2 = *(dgTreeNode **)
                    ((long)&(pdVar2->super_dgRedBackNode)._vptr_dgRedBackNode + lVar7);
        } while (pdVar2 != (dgTreeNode *)0x0);
      }
      lVar7 = 0;
      pdVar5 = local_40.m_ptr + 1;
      do {
        userdata[lVar7] = (HaI64)pdVar5->m_left;
        index[lVar7] = *(HaI32 *)&pdVar5->_vptr_dgRedBackNode;
        lVar7 = lVar7 + 1;
        pdVar5 = pdVar5->m_right;
      } while (pdVar5 != local_40.m_ptr + 1);
      pdVar3 = AddFace(this,(HaI32)lVar7,index,userdata);
      pdVar6 = pdVar3;
      do {
        pdVar6->m_incidentFace = *(HaI32 *)((long)&pdVar1[1]._vptr_dgRedBackNode + 4);
        pdVar6 = pdVar6->m_next;
      } while (pdVar6 != pdVar3);
    }
LAB_0087b08e:
    dgTree<dgEdge,_long>::Iterator::operator++(&local_40,0);
  } while( true );
}

Assistant:

dgPolyhedra::dgPolyhedra (const dgPolyhedra &polyhedra)
	:dgTree <dgEdge, hacd::HaI64>()
	,m_baseMark(0)
	,m_edgeMark(0)
	,m_faceSecuence(0)
{
	dgStack<hacd::HaI32> indexPool (1024 * 16);
	dgStack<hacd::HaU64> userPool (1024 * 16);
	hacd::HaI32* const index = &indexPool[0];
	hacd::HaU64* const user = &userPool[0];

	BeginFace ();
	Iterator iter(polyhedra);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (edge->m_incidentFace < 0) {
			continue;
		}

		if (!FindEdge(edge->m_incidentVertex, edge->m_twin->m_incidentVertex))	{
			hacd::HaI32 indexCount = 0;
			dgEdge* ptr = edge;
			do {
				user[indexCount] = ptr->m_userData;
				index[indexCount] = ptr->m_incidentVertex;
				indexCount ++;
				ptr = ptr->m_next;
			} while (ptr != edge);

			dgEdge* const face = AddFace (indexCount, index, (hacd::HaI64*) user);
			ptr = face;
			do {
				ptr->m_incidentFace = edge->m_incidentFace;
				ptr = ptr->m_next;
			} while (ptr != face);
		}
	}
	EndFace();

	m_faceSecuence = polyhedra.m_faceSecuence;

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck());
#endif
}